

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O1

void __thiscall
bloaty::dwarf::LineInfoReader::SeekToOffset
          (LineInfoReader *this,uint64_t offset,uint8_t address_size)

{
  string_view *psVar1;
  CompilationUnitSizes *this_00;
  pointer *ppbVar2;
  pointer *ppFVar3;
  uint8_t uVar4;
  byte bVar5;
  uchar uVar6;
  pointer pbVar7;
  iterator iVar8;
  pointer pFVar9;
  iterator iVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint64_t uVar14;
  ulong uVar15;
  size_t sVar16;
  uint16_t *puVar17;
  size_t sVar18;
  string_view dir;
  string_view local_78;
  FileName local_68;
  uint64_t local_40;
  size_t local_38;
  
  psVar1 = &this->file_->debug_line;
  uVar15 = psVar1->_M_len;
  local_78 = *psVar1;
  if (offset <= uVar15) {
    local_78._M_str = (this->file_->debug_line)._M_str + offset;
    local_78._M_len = uVar15 - offset;
    this_00 = &this->sizes_;
    CompilationUnitSizes::SetAddressSize(this_00,address_size);
    local_78 = CompilationUnitSizes::ReadInitialLength(this_00,&local_78);
    puVar17 = (uint16_t *)local_78._M_str;
    uVar15 = local_78._M_len;
    if (1 < uVar15) {
      local_78._M_str = (char *)(puVar17 + 1);
      local_78._M_len = uVar15 - 2;
      this_00->dwarf_version_ = *puVar17;
      uVar14 = CompilationUnitSizes::ReadDWARFOffset(this_00,&local_78);
      sVar16 = local_78._M_len;
      sVar18 = local_78._M_len - uVar14;
      if (local_78._M_len < uVar14) goto LAB_001b27ac;
      if (local_78._M_len != 0) {
        pcVar11 = local_78._M_str;
        uVar4 = *local_78._M_str;
        local_78._M_len = local_78._M_len - 1;
        local_78._M_str = local_78._M_str + 1;
        (this->params_).minimum_instruction_length = uVar4;
        if ((char)(this->sizes_).dwarf_version_ == '\x04') {
          if (local_78._M_len == 0) goto LAB_001b278a;
          uVar4 = pcVar11[1];
          local_78._M_str = pcVar11 + 2;
          local_78._M_len = sVar16 - 2;
          (this->params_).maximum_operations_per_instruction = uVar4;
          if (uVar4 == '\0') {
            Throw("DWARF line info had maximum_operations_per_instruction=0",0x5c);
          }
        }
        else {
          (this->params_).maximum_operations_per_instruction = '\x01';
        }
        sVar16 = local_78._M_len;
        if (local_78._M_len != 0) {
          pcVar12 = local_78._M_str;
          uVar4 = *local_78._M_str;
          local_78._M_len = local_78._M_len - 1;
          local_78._M_str = local_78._M_str + 1;
          (this->params_).default_is_stmt = uVar4;
          if (local_78._M_len != 0) {
            local_78._M_str = pcVar12 + 2;
            local_78._M_len = sVar16 - 2;
            (this->params_).line_base = pcVar12[1];
            if (sVar16 - 2 != 0) {
              uVar4 = pcVar12[2];
              local_78._M_str = pcVar12 + 3;
              local_78._M_len = sVar16 - 3;
              (this->params_).line_range = uVar4;
              if (sVar16 - 3 != 0) {
                bVar5 = pcVar12[3];
                local_78._M_str = pcVar12 + 4;
                local_78._M_len = sVar16 - 4;
                (this->params_).opcode_base = bVar5;
                if (uVar4 == '\0') {
                  Throw("line_range of zero will cause divide by zero",0x66);
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&this->standard_opcode_lengths_,(ulong)bVar5);
                if (1 < (this->params_).opcode_base) {
                  uVar15 = 1;
                  do {
                    if (local_78._M_len == 0) goto LAB_001b278a;
                    uVar6 = *local_78._M_str;
                    local_78._M_str = local_78._M_str + 1;
                    local_78._M_len = local_78._M_len - 1;
                    (this->standard_opcode_lengths_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15] = uVar6;
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < (this->params_).opcode_base);
                }
                pbVar7 = (this->include_directories_).
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((this->include_directories_).
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
                  (this->include_directories_).
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
                }
                local_68.name = (string_view)ZEXT816(0);
                iVar8._M_current =
                     (this->include_directories_).
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_40 = uVar14;
                local_38 = sVar18;
                if (iVar8._M_current ==
                    (this->include_directories_).
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                            ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                              *)&this->include_directories_,iVar8,&local_68.name);
                }
                else {
                  (iVar8._M_current)->_M_len = 0;
                  (iVar8._M_current)->_M_str = (char *)0x0;
                  ppbVar2 = &(this->include_directories_).
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppbVar2 = *ppbVar2 + 1;
                }
                do {
                  local_68.name = ReadUntilConsuming(&local_78,'\0');
                  sVar16 = local_68.name._M_len;
                  if (sVar16 == 0) break;
                  iVar8._M_current =
                       (this->include_directories_).
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar8._M_current ==
                      (this->include_directories_).
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                *)&this->include_directories_,iVar8,&local_68.name);
                  }
                  else {
                    (iVar8._M_current)->_M_len = sVar16;
                    (iVar8._M_current)->_M_str = local_68.name._M_str;
                    ppbVar2 = &(this->include_directories_).
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppbVar2 = *ppbVar2 + 1;
                  }
                } while (sVar16 != 0);
                pFVar9 = (this->filenames_).
                         super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((this->filenames_).
                    super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pFVar9) {
                  (this->filenames_).
                  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pFVar9;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_at_end(&this->expanded_filenames_,
                                  (this->expanded_filenames_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                local_68._16_8_ = 0;
                local_68.modified_time = 0;
                local_68.name = (string_view)ZEXT816(0);
                local_68.file_size = 0;
                iVar10._M_current =
                     (this->filenames_).
                     super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this->filenames_).
                    super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                  ::_M_realloc_insert<bloaty::dwarf::LineInfoReader::FileName>
                            (&this->filenames_,iVar10,&local_68);
                }
                else {
                  *(undefined8 *)&(iVar10._M_current)->directory_index = 0;
                  (iVar10._M_current)->modified_time = 0;
                  ((iVar10._M_current)->name)._M_len = 0;
                  ((iVar10._M_current)->name)._M_str = (char *)0x0;
                  (iVar10._M_current)->file_size = 0;
                  ppFVar3 = &(this->filenames_).
                             super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppFVar3 = *ppFVar3 + 1;
                }
                do {
                  local_68.name = (string_view)ZEXT816(0);
                  local_68.name = ReadUntilConsuming(&local_78,'\0');
                  sVar16 = local_68.name._M_len;
                  if (sVar16 == 0) break;
                  uVar13 = ReadLEB128<unsigned_int>(&local_78);
                  local_68.directory_index = uVar13;
                  local_68.modified_time = ReadLEB128Internal(false,&local_78);
                  local_68.file_size = ReadLEB128Internal(false,&local_78);
                  if ((ulong)((long)(this->include_directories_).
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->include_directories_).
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                      (local_68._16_8_ & 0xffffffff)) {
                    Throw("directory index out of range",0x8c);
                  }
                  iVar10._M_current =
                       (this->filenames_).
                       super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar10._M_current ==
                      (this->filenames_).
                      super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<bloaty::dwarf::LineInfoReader::FileName,std::allocator<bloaty::dwarf::LineInfoReader::FileName>>
                    ::_M_realloc_insert<bloaty::dwarf::LineInfoReader::FileName_const&>
                              ((vector<bloaty::dwarf::LineInfoReader::FileName,std::allocator<bloaty::dwarf::LineInfoReader::FileName>>
                                *)&this->filenames_,iVar10,&local_68);
                  }
                  else {
                    (iVar10._M_current)->file_size = local_68.file_size;
                    (iVar10._M_current)->directory_index = local_68.directory_index;
                    *(undefined4 *)&(iVar10._M_current)->field_0x14 = local_68._20_4_;
                    (iVar10._M_current)->modified_time = local_68.modified_time;
                    ((iVar10._M_current)->name)._M_len = local_68.name._M_len;
                    ((iVar10._M_current)->name)._M_str = local_68.name._M_str;
                    ppFVar3 = &(this->filenames_).
                               super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppFVar3 = *ppFVar3 + 1;
                  }
                } while (sVar16 != 0);
                uVar4 = (this->params_).default_is_stmt;
                (this->info_).address = 0;
                (this->info_).file = 1;
                (this->info_).line = 1;
                (this->info_).column = 0;
                (this->info_).discriminator = 0;
                (this->info_).end_sequence = false;
                (this->info_).basic_block = false;
                (this->info_).prologue_end = false;
                (this->info_).epilogue_begin = false;
                (this->info_).is_stmt = uVar4 != '\0';
                (this->info_).op_index = '\0';
                (this->info_).isa = '\0';
                (this->remaining_)._M_len = local_38;
                (this->remaining_)._M_str = pcVar11 + local_40;
                this->shadow_ = false;
                return;
              }
            }
          }
        }
      }
    }
LAB_001b278a:
    Throw("premature EOF reading fixed-length data",0x8d);
  }
LAB_001b27ac:
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

void LineInfoReader::SeekToOffset(uint64_t offset, uint8_t address_size) {
  string_view data = file_.debug_line;
  SkipBytes(offset, &data);

  sizes_.SetAddressSize(address_size);
  data = sizes_.ReadInitialLength(&data);
  sizes_.ReadDWARFVersion(&data);
  uint64_t header_length = sizes_.ReadDWARFOffset(&data);
  string_view program = data;
  SkipBytes(header_length, &program);

  params_.minimum_instruction_length = ReadFixed<uint8_t>(&data);
  if (sizes_.dwarf_version() == 4) {
    params_.maximum_operations_per_instruction = ReadFixed<uint8_t>(&data);

    if (params_.maximum_operations_per_instruction == 0) {
      THROW("DWARF line info had maximum_operations_per_instruction=0");
    }
  } else {
    params_.maximum_operations_per_instruction = 1;
  }
  params_.default_is_stmt = ReadFixed<uint8_t>(&data);
  params_.line_base = ReadFixed<int8_t>(&data);
  params_.line_range = ReadFixed<uint8_t>(&data);
  params_.opcode_base = ReadFixed<uint8_t>(&data);
  if (params_.line_range == 0) {
    THROW("line_range of zero will cause divide by zero");
  }

  standard_opcode_lengths_.resize(params_.opcode_base);
  for (size_t i = 1; i < params_.opcode_base; i++) {
    standard_opcode_lengths_[i] = ReadFixed<uint8_t>(&data);
  }

  // Read include_directories.
  include_directories_.clear();

  // Implicit current directory entry.
  include_directories_.push_back(string_view());

  while (true) {
    string_view dir = ReadNullTerminated(&data);
    if (dir.empty()) {
      break;
    }
    include_directories_.push_back(dir);
  }

  // Read file_names.
  filenames_.clear();
  expanded_filenames_.clear();

  // Filename 0 is unused.
  filenames_.push_back(FileName());
  while (true) {
    FileName file_name;
    file_name.name = ReadNullTerminated(&data);
    if (file_name.name.empty()) {
      break;
    }
    file_name.directory_index = ReadLEB128<uint32_t>(&data);
    file_name.modified_time = ReadLEB128<uint64_t>(&data);
    file_name.file_size = ReadLEB128<uint64_t>(&data);
    if (file_name.directory_index >= include_directories_.size()) {
      THROW("directory index out of range");
    }
    filenames_.push_back(file_name);
  }

  info_ = LineInfo(params_.default_is_stmt);
  remaining_ = program;
  shadow_ = false;
}